

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

Type * __thiscall
soul::heart::Parser::parseBoundedIntType(Type *__return_storage_ptr__,Parser *this,bool isWrap)

{
  long lVar1;
  Type local_78;
  CompileMessage local_60;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x263773);
  lVar1 = (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).literalIntValue;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x26369e);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x289596);
  if (0x7ffffffd < lVar1 - 1U) {
    CompileMessageHelpers::createMessage<>(&local_60,syntax,error,"Illegal size");
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_60);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.description._M_dataplus._M_p != &local_60.description.field_2) {
      operator_delete(local_60.description._M_dataplus._M_p,
                      local_60.description.field_2._M_allocated_capacity + 1);
    }
  }
  local_78.boundingSize = (BoundedIntSize)lVar1;
  if (isWrap) {
    local_78.category = wrap;
    if (0x7ffffffd < local_78.boundingSize - 1U) {
      throwInternalCompilerError("isLegalBoundedIntSize (size)","createWrappedInt",0x165);
    }
  }
  else {
    local_78.category = clamp;
    if (0x7ffffffd < local_78.boundingSize - 1U) {
      throwInternalCompilerError("isLegalBoundedIntSize (size)","createClampedInt",0x16b);
    }
  }
  local_78.arrayElementCategory = invalid;
  local_78.isRef = false;
  local_78.isConstant = false;
  local_78.arrayElementBoundingSize = 0;
  local_78.structure.object._0_1_ = 0;
  local_78.structure.object._1_7_ = 0;
  local_78.primitiveType.type = int32;
  parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_78);
  if (isWrap) {
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)
               CONCAT71(local_78.structure.object._1_7_,local_78.structure.object._0_1_));
  }
  else {
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)
               CONCAT71(local_78.structure.object._1_7_,local_78.structure.object._0_1_));
  }
  return __return_storage_ptr__;
}

Assistant:

Type parseBoundedIntType (bool isWrap)
    {
        expect (HEARTOperator::lessThan);
        auto size = parseLiteralInt();
        expect (HEARTOperator::greaterThan);

        if (! Type::isLegalBoundedIntSize (size))
            throwError (Errors::illegalSize());

        auto boundedSize = static_cast<Type::BoundedIntSize> (size);
        return parseArrayTypeSuffixes (isWrap ? Type::createWrappedInt (boundedSize)
                                              : Type::createClampedInt (boundedSize));
    }